

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O0

void __thiscall ImplSimd<SimdAVX>::RGB2YUV(ImplSimd<SimdAVX> *this,RGB *rgb,YUV420 *yuv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *in_RDX;
  long *in_RSI;
  undefined8 extraout_XMM0_Qa;
  uint8_t *extraout_XMM0_Qb;
  VectorType *b_00;
  VectorType *a;
  Vector e;
  Vector d;
  Vector c;
  size_t i;
  uint8_t *b;
  uint8_t *g;
  uint8_t *r;
  uint8_t *v;
  uint8_t *u;
  uint8_t *y;
  undefined8 in_stack_fffffffffffffa40;
  int imm8;
  VectorType *in_stack_fffffffffffffa48;
  short c_00;
  VectorType *in_stack_fffffffffffffa50;
  uint8_t *in_stack_fffffffffffffaa8;
  VectorType *in_stack_fffffffffffffab0;
  ulong local_80;
  
  if (in_RDX[1] != *in_RSI) {
    __assert_fail("yuv->height_ == rgb->height_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3d,"virtual void ImplSimd<SimdAVX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdAVX]")
    ;
  }
  if (*in_RDX == in_RSI[1]) {
    if ((in_RDX[2] & 0xfU) == 0) {
      lVar1 = in_RDX[5];
      lVar2 = in_RSI[3];
      lVar3 = in_RSI[4];
      lVar4 = in_RSI[5];
      for (local_80 = 0; local_80 < (ulong)in_RDX[2]; local_80 = local_80 + 0x10) {
        SimdAVX::Load((VectorType *)(lVar2 + local_80),(uint8_t *)in_RSI);
        SimdAVX::Load((VectorType *)(lVar3 + local_80),(uint8_t *)in_RSI);
        SimdAVX::Load((VectorType *)(lVar4 + local_80),(uint8_t *)in_RSI);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Add(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Add(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Add(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        imm8 = (int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
        SimdAVX::Rli(in_stack_fffffffffffffa48,imm8);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Add(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Store(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Sub(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Sub(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Add(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Rli(in_stack_fffffffffffffa48,imm8);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Add(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        a = (VectorType *)0x0;
        SimdAVX::Store(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Sub(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        in_stack_fffffffffffffaa8 = extraout_XMM0_Qb;
        in_stack_fffffffffffffab0 = a;
        SimdAVX::Sub(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffa50 >> 0x20));
        SimdAVX::Add(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        c_00 = (short)((ulong)in_stack_fffffffffffffa50 >> 0x20);
        SimdAVX::Rli(in_stack_fffffffffffffa48,imm8);
        SimdAVX::Constant(c_00);
        in_stack_fffffffffffffa48 = b_00;
        SimdAVX::Add(a,b_00);
        in_RSI = (long *)(lVar1 + local_80);
        SimdAVX::Store(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        SimdAVX::Empty();
        in_stack_fffffffffffffa40 = extraout_XMM0_Qa;
        in_stack_fffffffffffffa50 = a;
      }
      return;
    }
    __assert_fail("yuv->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3f,"virtual void ImplSimd<SimdAVX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdAVX]")
    ;
  }
  __assert_fail("yuv->width_ == rgb->width_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x3e,"virtual void ImplSimd<SimdAVX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdAVX]");
}

Assistant:

void ImplSimd<SIMD>::RGB2YUV(RGB *rgb, YUV420 *yuv) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);

    /*
    y[i] = clamp(((66 * c + 129 * d + 25 * e + 128) >> 8) + 16);
    u[i] = clamp(((-38 * c - 74 * d + 112 * e + 128) >> 8) + 128);
    v[i] = clamp(((112 * c - 94 * d - 18 * e + 128) >> 8) + 128);
     */
    store(add(rli(add(add(add(mul(cn(66),c), mul(cn(129), d)), mul(cn(25), e)), cn(128)),8), cn(16)), y+i);
    store(add(rli(add(sub(sub(mul(cn(112),e), mul(cn(38), c)), mul(cn(74), d)), cn(128)),8), cn(128)), u+i);
    store(add(rli(add(sub(sub(mul(cn(112),c), mul(cn(94), d)), mul(cn(18), e)), cn(128)),8), cn(128)), v+i);
    SIMD::Empty();
  }

}